

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.hpp
# Opt level: O3

shared_ptr<unsigned_char> __thiscall
pstore::in_memory_mapper::pointer(in_memory_mapper *this,in_memory *file,uint64_t offset)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<unsigned_char> sVar2;
  
  peVar1 = (file->buffer_).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (file->buffer_).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_memory_mapper_base)._vptr_memory_mapper_base = (_func_int **)(peVar1 + offset);
    (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    goto LAB_0015e3e0;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0015e3b0;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_0015e3b0:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  (this->super_memory_mapper_base)._vptr_memory_mapper_base = (_func_int **)(peVar1 + offset);
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  offset = (uint64_t)extraout_RDX;
LAB_0015e3e0:
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)offset;
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<unsigned_char>)
         sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<std::uint8_t> pointer (pstore::file::in_memory & file,
                                                      std::uint64_t const offset) {
            auto const p = std::static_pointer_cast<std::uint8_t> (file.data ());
            return std::shared_ptr<std::uint8_t> (p, p.get () + offset);
        }